

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O0

void __thiscall DSDcc::DSDNXDN::DSDNXDN(DSDNXDN *this,DSDDecoder *dsdDecoder)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  CACOutbound *in_stack_ffffffffffffffb0;
  UDCH *this_00;
  SACCH *this_01;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0;
  NXDNLICH::NXDNLICH((NXDNLICH *)((long)in_RDI + 0xc));
  PN_9_5::PN_9_5((PN_9_5 *)in_stack_ffffffffffffffb0,
                 (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  *(undefined1 *)((long)in_RDI + 0x264) = 0;
  *(undefined4 *)(in_RDI + 0x4f) = 0;
  *(undefined4 *)((long)in_RDI + 0x27c) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  CACOutbound::CACOutbound(in_stack_ffffffffffffffb0);
  this_01 = (SACCH *)(in_RDI + 0xb9);
  CACShort::CACShort((CACShort *)in_stack_ffffffffffffffb0);
  CACLong::CACLong((CACLong *)in_stack_ffffffffffffffb0);
  this_00 = (UDCH *)(in_RDI + 0x174);
  SACCH::SACCH(this_01);
  FACCH1::FACCH1((FACCH1 *)this_00);
  UDCH::UDCH(this_00);
  in_RDI[0x25c] = 0;
  in_RDI[0x25d] = 0;
  in_RDI[0x25e] = 0;
  in_RDI[0x25f] = 0;
  memset((void *)((long)in_RDI + 0x265),0,10);
  memset((void *)((long)in_RDI + 0x26f),0,8);
  *(undefined4 *)((long)in_RDI + 0x284) = 4;
  *(undefined4 *)(in_RDI + 0x51) = 0;
  *(undefined4 *)((long)in_RDI + 0x28c) = 4;
  *(undefined4 *)((long)in_RDI + 0x294) = 0;
  *(undefined1 *)(in_RDI + 0x53) = 1;
  *(undefined2 *)((long)in_RDI + 0x29a) = 0;
  *(undefined2 *)((long)in_RDI + 0x29c) = 0;
  *(undefined1 *)((long)in_RDI + 0x29e) = 0;
  *(undefined1 *)(in_RDI + 0x52) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined2 *)((long)in_RDI + 0x2a4) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a6) = 0;
  *(undefined1 *)((long)in_RDI + 0x12dc) = 0;
  return;
}

Assistant:

DSDNXDN::DSDNXDN(DSDDecoder *dsdDecoder) :
		m_dsdDecoder(dsdDecoder),
		m_state(NXDNFrame),
		m_pn(0xe4), // TS 1A v0103 section 4.6
		m_inSync(false),
		m_lichEvenParity(0),
		m_symbolIndex(0),
		m_swallowCount(0),
        w(0),
        x(0),
        y(0),
        z(0)
{
    memset(m_syncBuffer, 0, 10);
    memset(m_lichBuffer, 0, 8);

    m_rfChannel = NXDNRFCHUnknown;
    m_frameStructure = NXDNFSReserved;
    m_steal = NXDNStealReserved;
    m_ran = 0;
    m_idle = true;
    m_sourceId = 0;
    m_destinationId = 0;
    m_group = false;
    m_messageType = 0;
    m_locationId = 0;
    m_services = 0;
    m_fullRate = false;

    m_rfChannelStr[0] = '\0';
}